

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_reporter_sonarqube.hpp
# Opt level: O0

void __thiscall
Catch::SonarQubeReporter::testRunStarting(SonarQubeReporter *this,TestRunInfo *testRunInfo)

{
  TestRunInfo *in_RSI;
  CumulativeReporterBase<Catch::SonarQubeReporter> *in_RDI;
  undefined8 in_stack_ffffffffffffff70;
  CumulativeReporterBase<Catch::SonarQubeReporter> *this_00;
  allocator local_69;
  string local_68 [55];
  allocator local_31;
  char (*in_stack_ffffffffffffffd0) [2];
  string *in_stack_ffffffffffffffd8;
  XmlWriter *in_stack_ffffffffffffffe0;
  
  CumulativeReporterBase<Catch::SonarQubeReporter>::testRunStarting(in_RDI,in_RSI);
  this_00 = in_RDI + 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&stack0xffffffffffffffd0,"testExecutions",&local_31);
  operator|(Newline,Indent);
  XmlWriter::startElement
            ((XmlWriter *)this_00,(string *)in_RDI,
             (XmlFormatting)((ulong)in_stack_ffffffffffffff70 >> 0x20));
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffd0);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_68,"version",&local_69);
  XmlWriter::writeAttribute<char[2]>
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  std::__cxx11::string::~string(local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  return;
}

Assistant:

void testRunStarting(TestRunInfo const& testRunInfo) override {
            CumulativeReporterBase::testRunStarting(testRunInfo);
            xml.startElement("testExecutions");
            xml.writeAttribute("version", "1");
        }